

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_global.c
# Opt level: O0

TA_RetCode TA_Initialize(void)

{
  TA_CandleSettingType in_stack_00000110;
  
  memset(TA_Globals,0,0x1d8);
  TA_Globals->magicNb = 0xa203b203;
  TA_RestoreCandleDefaultSettings(in_stack_00000110);
  return TA_SUCCESS;
}

Assistant:

TA_RetCode TA_Initialize( void )
{
   /* Initialize the "global variable" used to manage the global
    * variables of all other modules...
    */
   memset( TA_Globals, 0, sizeof( TA_LibcPriv ) );
   TA_Globals->magicNb = TA_LIBC_PRIV_MAGIC_NB;

   /*** At this point, TA_Shutdown can be called to clean-up. ***/

   /* Set the default value to global variables */
   TA_RestoreCandleDefaultSettings( TA_AllCandleSettings );

   return TA_SUCCESS;
}